

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hqnx_32_common.h
# Opt level: O0

uint32_t Interpolate_2(uint32_t c1,int w1,uint32_t c2,int w2,int s)

{
  byte bVar1;
  int s_local;
  int w2_local;
  uint32_t c2_local;
  int w1_local;
  uint32_t c1_local;
  
  w1_local = c1;
  if (c1 != c2) {
    bVar1 = (byte)s;
    w1_local = ((c1 >> 0x18) * w1 + (c2 >> 0x18) * w2 << (0x18 - bVar1 & 0x1f) & 0xff000000) +
               ((c1 & 0xff00) * w1 + (c2 & 0xff00) * w2 >> (bVar1 & 0x1f) & 0xff00) +
               ((c1 & 0xff00ff) * w1 + (c2 & 0xff00ff) * w2 >> (bVar1 & 0x1f) & 0xff00ff);
  }
  return w1_local;
}

Assistant:

static inline uint32_t Interpolate_2(uint32_t c1, int w1, uint32_t c2, int w2, int s)
{
    if (c1 == c2) {
        return c1;
    }
    return
        (((((c1 & MASK_ALPHA) >> 24) * w1 + ((c2 & MASK_ALPHA) >> 24) * w2) << (24-s)) & MASK_ALPHA) +
        ((((c1 & MASK_2) * w1 + (c2 & MASK_2) * w2) >> s) & MASK_2)	+
        ((((c1 & MASK_13) * w1 + (c2 & MASK_13) * w2) >> s) & MASK_13);
}